

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPackageCommand::CheckVersionFile
          (cmFindPackageCommand *this,string *version_file,string *result_version)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  string_view value;
  string_view value_00;
  string_view value_01;
  uint parsed_major;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  uint parsed_minor;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  uint parsed_tweak;
  uint parsed_patch;
  cmMakefile *local_50;
  PolicyPushPop polScope;
  
  pcVar1 = (this->super_cmFindCommon).Makefile;
  cmMakefile::PushScope(pcVar1);
  local_50 = pcVar1;
  cmMakefile::PolicyPushPop::PolicyPushPop(&polScope,(this->super_cmFindCommon).Makefile);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  _parsed_major = (cmFindPackageCommand *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parsed_major,"PACKAGE_VERSION","");
  cmMakefile::RemoveDefinition(pcVar1,(string *)&parsed_major);
  if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
    operator_delete((void *)_parsed_major,local_88._0_8_ + 1);
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  _parsed_major = (cmFindPackageCommand *)local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&parsed_major,"PACKAGE_VERSION_UNSUITABLE","");
  cmMakefile::RemoveDefinition(pcVar1,(string *)&parsed_major);
  if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
    operator_delete((void *)_parsed_major,local_88._0_8_ + 1);
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  _parsed_major = (cmFindPackageCommand *)local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&parsed_major,"PACKAGE_VERSION_COMPATIBLE","");
  cmMakefile::RemoveDefinition(pcVar1,(string *)&parsed_major);
  if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
    operator_delete((void *)_parsed_major,local_88._0_8_ + 1);
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  _parsed_major = (cmFindPackageCommand *)local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&parsed_major,"PACKAGE_VERSION_EXACT","");
  cmMakefile::RemoveDefinition(pcVar1,(string *)&parsed_major);
  if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
    operator_delete((void *)_parsed_major,local_88._0_8_ + 1);
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  _parsed_major = (cmFindPackageCommand *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parsed_major,"PACKAGE_FIND_NAME","");
  value._M_str = (this->Name)._M_dataplus._M_p;
  value._M_len = (this->Name)._M_string_length;
  cmMakefile::AddDefinition(pcVar1,(string *)&parsed_major,value);
  if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
    operator_delete((void *)_parsed_major,local_88._0_8_ + 1);
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  _parsed_major = (cmFindPackageCommand *)local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&parsed_major,"PACKAGE_FIND_VERSION_COMPLETE","");
  value_00._M_str = (this->VersionComplete)._M_dataplus._M_p;
  value_00._M_len = (this->VersionComplete)._M_string_length;
  cmMakefile::AddDefinition(pcVar1,(string *)&parsed_major,value_00);
  if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
    operator_delete((void *)_parsed_major,local_88._0_8_ + 1);
  }
  uStack_90 = 0;
  local_88._8_8_ =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2383:24)>
       ::_M_invoke;
  local_88._0_8_ =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2383:24)>
       ::_M_manager;
  _parsed_major = this;
  _parsed_minor = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parsed_minor,"PACKAGE_FIND_VERSION","")
  ;
  SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&parsed_major,(string *)&parsed_minor,&this->Version,this->VersionCount,
                      this->VersionMajor,this->VersionMinor,this->VersionPatch,this->VersionTweak);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_parsed_minor != &local_68) {
    operator_delete(_parsed_minor,(ulong)(local_68._M_allocated_capacity + 1));
  }
  if ((code *)local_88._0_8_ != (code *)0x0) {
    (*(code *)local_88._0_8_)(&parsed_major,&parsed_major,3);
  }
  if ((this->VersionRange)._M_string_length != 0) {
    uStack_90 = 0;
    local_88._8_8_ =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2383:24)>
         ::_M_invoke;
    local_88._0_8_ =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2383:24)>
         ::_M_manager;
    _parsed_major = this;
    _parsed_minor = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parsed_minor,"PACKAGE_FIND_VERSION_MIN","");
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&parsed_major,(string *)&parsed_minor,&this->Version,this->VersionCount,
                        this->VersionMajor,this->VersionMinor,this->VersionPatch,this->VersionTweak)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_parsed_minor != &local_68) {
      operator_delete(_parsed_minor,(ulong)(local_68._M_allocated_capacity + 1));
    }
    if ((code *)local_88._0_8_ != (code *)0x0) {
      (*(code *)local_88._0_8_)(&parsed_major,&parsed_major,3);
    }
    uStack_90 = 0;
    local_88._8_8_ =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2383:24)>
         ::_M_invoke;
    local_88._0_8_ =
         std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2383:24)>
         ::_M_manager;
    _parsed_major = this;
    _parsed_minor = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parsed_minor,"PACKAGE_FIND_VERSION_MAX","");
    SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionMaxPatch,
                        (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                         *)&parsed_major,(string *)&parsed_minor,&this->VersionMax,
                        this->VersionMaxCount,this->VersionMaxMajor,this->VersionMaxMinor,
                        this->VersionMaxPatch,this->VersionMaxTweak);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_parsed_minor != &local_68) {
      operator_delete(_parsed_minor,(ulong)(local_68._M_allocated_capacity + 1));
    }
    if ((code *)local_88._0_8_ != (code *)0x0) {
      (*(code *)local_88._0_8_)(&parsed_major,&parsed_major,3);
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    _parsed_major = (cmFindPackageCommand *)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parsed_major,"PACKAGE_FIND_VERSION_RANGE","");
    value_01._M_str = (this->VersionComplete)._M_dataplus._M_p;
    value_01._M_len = (this->VersionComplete)._M_string_length;
    cmMakefile::AddDefinition(pcVar1,(string *)&parsed_major,value_01);
    if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
      operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    _parsed_major = (cmFindPackageCommand *)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parsed_major,"PACKAGE_FIND_VERSION_RANGE_MIN","");
    cmMakefile::AddDefinition(pcVar1,(string *)&parsed_major,this->VersionRangeMin);
    if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
      operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    _parsed_major = (cmFindPackageCommand *)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parsed_major,"PACKAGE_FIND_VERSION_RANGE_MAX","");
    cmMakefile::AddDefinition(pcVar1,(string *)&parsed_major,this->VersionRangeMax);
    if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
      operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
    }
  }
  bVar2 = ReadListFile(this,version_file,NoPolicyScope);
  if (bVar2) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    _parsed_major = (cmFindPackageCommand *)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parsed_major,"PACKAGE_VERSION_EXACT","");
    bVar3 = cmMakefile::IsOn(pcVar1,(string *)&parsed_major);
    if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
      operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    _parsed_major = (cmFindPackageCommand *)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&parsed_major,"PACKAGE_VERSION_UNSUITABLE","");
    bVar2 = cmMakefile::IsOn(pcVar1,(string *)&parsed_major);
    if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
      operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
    }
    if ((!bVar3) && (this->VersionExact == false)) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      _parsed_major = (cmFindPackageCommand *)local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&parsed_major,"PACKAGE_VERSION_COMPATIBLE","");
      bVar3 = cmMakefile::IsOn(pcVar1,(string *)&parsed_major);
      if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
        operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
      }
    }
    if (bVar3 == false && !bVar2) {
      bVar2 = (this->Version)._M_string_length == 0;
    }
    else {
      bVar2 = !bVar2;
    }
    if (bVar2 != false) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      _parsed_major = (cmFindPackageCommand *)local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parsed_major,"PACKAGE_VERSION","");
      cmMakefile::GetSafeDefinition(pcVar1,(string *)&parsed_major);
      std::__cxx11::string::_M_assign((string *)&this->VersionFound);
      if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
        operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
      }
      uVar4 = __isoc99_sscanf((this->VersionFound)._M_dataplus._M_p,"%u.%u.%u.%u",&parsed_major,
                              &parsed_minor,&parsed_patch,&parsed_tweak);
      this->VersionFoundCount = uVar4;
      switch(uVar4) {
      case 4:
        this->VersionFoundTweak = parsed_tweak;
      case 3:
        this->VersionFoundPatch = parsed_patch;
      case 2:
        this->VersionFoundMinor = parsed_minor;
      case 1:
        this->VersionFoundMajor = parsed_major;
      }
    }
  }
  else {
    bVar2 = false;
  }
  pcVar1 = (this->super_cmFindCommon).Makefile;
  _parsed_major = (cmFindPackageCommand *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parsed_major,"PACKAGE_VERSION","");
  cmMakefile::GetSafeDefinition(pcVar1,(string *)&parsed_major);
  std::__cxx11::string::_M_assign((string *)result_version);
  if ((cmFindPackageCommand *)_parsed_major != (cmFindPackageCommand *)local_88) {
    operator_delete((void *)_parsed_major,(ulong)(local_88._0_8_ + 1));
  }
  if (result_version->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)result_version,0,(char *)0x0,0x70b647);
  }
  cmMakefile::PolicyPushPop::~PolicyPushPop(&polScope);
  cmMakefile::PopScope(local_50);
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::CheckVersionFile(std::string const& version_file,
                                            std::string& result_version)
{
  // The version file will be loaded in an isolated scope.
  cmMakefile::ScopePushPop const varScope(this->Makefile);
  cmMakefile::PolicyPushPop const polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  // Clear the output variables.
  this->Makefile->RemoveDefinition("PACKAGE_VERSION");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_UNSUITABLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_COMPATIBLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_EXACT");

  // Set the input variables.
  this->Makefile->AddDefinition("PACKAGE_FIND_NAME", this->Name);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_COMPLETE",
                                this->VersionComplete);

  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->Makefile->AddDefinition(variable, value);
  };
  this->SetVersionVariables(addDefinition, "PACKAGE_FIND_VERSION",
                            this->Version, this->VersionCount,
                            this->VersionMajor, this->VersionMinor,
                            this->VersionPatch, this->VersionTweak);
  if (!this->VersionRange.empty()) {
    this->SetVersionVariables(addDefinition, "PACKAGE_FIND_VERSION_MIN",
                              this->Version, this->VersionCount,
                              this->VersionMajor, this->VersionMinor,
                              this->VersionPatch, this->VersionTweak);
    this->SetVersionVariables(addDefinition, "PACKAGE_FIND_VERSION_MAX",
                              this->VersionMax, this->VersionMaxCount,
                              this->VersionMaxMajor, this->VersionMaxMinor,
                              this->VersionMaxPatch, this->VersionMaxTweak);

    this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_RANGE",
                                  this->VersionComplete);
    this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_RANGE_MIN",
                                  this->VersionRangeMin);
    this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_RANGE_MAX",
                                  this->VersionRangeMax);
  }

  // Load the version check file.  Pass NoPolicyScope because we do
  // our own policy push/pop independent of CMP0011.
  bool suitable = false;
  if (this->ReadListFile(version_file, NoPolicyScope)) {
    // Check the output variables.
    bool okay = this->Makefile->IsOn("PACKAGE_VERSION_EXACT");
    bool const unsuitable = this->Makefile->IsOn("PACKAGE_VERSION_UNSUITABLE");
    if (!okay && !this->VersionExact) {
      okay = this->Makefile->IsOn("PACKAGE_VERSION_COMPATIBLE");
    }

    // The package is suitable if the version is okay and not
    // explicitly unsuitable.
    suitable = !unsuitable && (okay || this->Version.empty());
    if (suitable) {
      // Get the version found.
      this->VersionFound =
        this->Makefile->GetSafeDefinition("PACKAGE_VERSION");

      // Try to parse the version number and store the results that were
      // successfully parsed.
      unsigned int parsed_major;
      unsigned int parsed_minor;
      unsigned int parsed_patch;
      unsigned int parsed_tweak;
      this->VersionFoundCount =
        parseVersion(this->VersionFound, parsed_major, parsed_minor,
                     parsed_patch, parsed_tweak);
      switch (this->VersionFoundCount) {
        case 4:
          this->VersionFoundTweak = parsed_tweak;
          CM_FALLTHROUGH;
        case 3:
          this->VersionFoundPatch = parsed_patch;
          CM_FALLTHROUGH;
        case 2:
          this->VersionFoundMinor = parsed_minor;
          CM_FALLTHROUGH;
        case 1:
          this->VersionFoundMajor = parsed_major;
          CM_FALLTHROUGH;
        default:
          break;
      }
    }
  }

  result_version = this->Makefile->GetSafeDefinition("PACKAGE_VERSION");
  if (result_version.empty()) {
    result_version = "unknown";
  }

  // Succeed if the version is suitable.
  return suitable;
}